

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawRectangleLines(int posX,int posY,int width,int height,Color color)

{
  int height_local;
  int width_local;
  int posY_local;
  int posX_local;
  Color color_local;
  
  DrawRectangle(posX,posY,width,1,color);
  DrawRectangle(posX + width + -1,posY + 1,1,height + -2,color);
  DrawRectangle(posX,posY + height + -1,width,1,color);
  DrawRectangle(posX,posY + 1,1,height + -2,color);
  return;
}

Assistant:

void DrawRectangleLines(int posX, int posY, int width, int height, Color color)
{
#if defined(SUPPORT_QUADS_DRAW_MODE)
    DrawRectangle(posX, posY, width, 1, color);
    DrawRectangle(posX + width - 1, posY + 1, 1, height - 2, color);
    DrawRectangle(posX, posY + height - 1, width, 1, color);
    DrawRectangle(posX, posY + 1, 1, height - 2, color);
#else
    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2i(posX + 1, posY + 1);
        rlVertex2i(posX + width, posY + 1);

        rlVertex2i(posX + width, posY + 1);
        rlVertex2i(posX + width, posY + height);

        rlVertex2i(posX + width, posY + height);
        rlVertex2i(posX + 1, posY + height);

        rlVertex2i(posX + 1, posY + height);
        rlVertex2i(posX + 1, posY + 1);
    rlEnd();
#endif
}